

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# propagator.h
# Opt level: O0

Clause * Reason_new(int sz)

{
  Clause *this;
  int in_EDI;
  vec<Clause_*> *unaff_retaddr;
  Clause *c;
  undefined4 in_stack_fffffffffffffff8;
  
  this = (Clause *)malloc((long)in_EDI * 4 + 8);
  Clause::clearFlags(this);
  *(uint *)this = *(uint *)this & 0xfffffffd | 2;
  *(uint *)this = *(uint *)this & 0xff | in_EDI << 8;
  vec<vec<Clause_*>_>::last(&sat.rtrail);
  vec<Clause_*>::push(unaff_retaddr,(Clause **)CONCAT44(in_EDI,in_stack_fffffffffffffff8));
  return this;
}

Assistant:

static inline Clause* Reason_new(int sz) {
	auto* c = (Clause*)malloc(sizeof(Clause) + sz * sizeof(Lit));
	c->clearFlags();
	c->temp_expl = 1;
	c->sz = sz;
	sat.rtrail.last().push(c);
	return c;
}